

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gtest-extra.cc
# Opt level: O0

string * format_system_error_abi_cxx11_(int error_code,StringRef message)

{
  BasicMemoryWriter<char,_std::allocator<char>_> *in_RDI;
  int in_stack_0000002c;
  Writer *in_stack_00000030;
  StringRef in_stack_00000038;
  MemoryWriter out;
  BasicMemoryWriter<char,_std::allocator<char>_> *this;
  allocator<char> *in_stack_fffffffffffffd88;
  BasicMemoryWriter<char,_std::allocator<char>_> *in_stack_fffffffffffffd90;
  BasicWriter<char> *in_stack_fffffffffffffda8;
  allocator<char> local_249 [585];
  
  this = in_RDI;
  std::allocator<char>::allocator();
  fmt::BasicMemoryWriter<char,_std::allocator<char>_>::BasicMemoryWriter
            (in_stack_fffffffffffffd90,in_stack_fffffffffffffd88);
  std::allocator<char>::~allocator(local_249);
  fmt::internal::format_system_error(in_stack_00000030,in_stack_0000002c,in_stack_00000038);
  fmt::BasicWriter<char>::str_abi_cxx11_(in_stack_fffffffffffffda8);
  fmt::BasicMemoryWriter<char,_std::allocator<char>_>::~BasicMemoryWriter(this);
  return (string *)in_RDI;
}

Assistant:

std::string format_system_error(int error_code, fmt::StringRef message) {
  fmt::MemoryWriter out;
  fmt::internal::format_system_error(out, error_code, message);
  return out.str();
}